

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cOHz.cpp
# Opt level: O0

Vector<double,_4U> * __thiscall
OpenMD::COHZ::calcCorrVal(COHZ *this,int frame1,int frame2,int id1,int id2)

{
  reference pvVar1;
  Vector<double,_3U> *v2;
  double *pdVar2;
  double *pdVar3;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  Vector<double,_4U> *in_RDI;
  int in_R8D;
  int in_R9D;
  Vector<double,_3U> *v1;
  double dVar4;
  Polynomial<double> *this_00;
  Vector3d h2;
  Vector3d h1;
  Vector3d w2;
  Vector3d w1;
  Vector3d u2;
  Vector3d u1;
  Vector3d v2z;
  Vector3d v2y;
  Vector3d v1z;
  Vector3d v1y;
  Vector<double,_4U> *r;
  Vector<double,_3U> *in_stack_fffffffffffffc78;
  Vector<double,_3U> *in_stack_fffffffffffffc80;
  Vector<double,_3U> *in_stack_fffffffffffffc88;
  Vector<double,_3U> *in_stack_fffffffffffffc90;
  RectMatrix<double,_3U,_3U> *in_stack_fffffffffffffc98;
  double *in_stack_fffffffffffffca8;
  Polynomial<double> *in_stack_fffffffffffffcb0;
  double local_2c8 [85];
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  
  local_20 = in_R9D;
  local_1c = in_R8D;
  local_18 = in_ECX;
  local_14 = in_EDX;
  pvVar1 = std::
           vector<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>,_std::allocator<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>_>_>
           ::operator[]((vector<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>,_std::allocator<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>_>_>
                         *)(in_RSI + 0xeb8),(long)in_EDX);
  std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>::
  operator[](pvVar1,(long)local_1c);
  RectMatrix<double,_3U,_3U>::getRow
            (in_stack_fffffffffffffc98,(uint)((ulong)in_stack_fffffffffffffc90 >> 0x20));
  Vector3<double>::Vector3((Vector3<double> *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
  pvVar1 = std::
           vector<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>,_std::allocator<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>_>_>
           ::operator[]((vector<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>,_std::allocator<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>_>_>
                         *)(in_RSI + 0xeb8),(long)local_14);
  std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>::
  operator[](pvVar1,(long)local_1c);
  RectMatrix<double,_3U,_3U>::getRow
            (in_stack_fffffffffffffc98,(uint)((ulong)in_stack_fffffffffffffc90 >> 0x20));
  Vector3<double>::Vector3((Vector3<double> *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
  pvVar1 = std::
           vector<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>,_std::allocator<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>_>_>
           ::operator[]((vector<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>,_std::allocator<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>_>_>
                         *)(in_RSI + 0xeb8),(long)local_18);
  std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>::
  operator[](pvVar1,(long)local_20);
  RectMatrix<double,_3U,_3U>::getRow
            (in_stack_fffffffffffffc98,(uint)((ulong)in_stack_fffffffffffffc90 >> 0x20));
  Vector3<double>::Vector3((Vector3<double> *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
  pvVar1 = std::
           vector<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>,_std::allocator<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>_>_>
           ::operator[]((vector<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>,_std::allocator<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>_>_>
                         *)(in_RSI + 0xeb8),(long)local_18);
  std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>::
  operator[](pvVar1,(long)local_20);
  RectMatrix<double,_3U,_3U>::getRow
            (in_stack_fffffffffffffc98,(uint)((ulong)in_stack_fffffffffffffc90 >> 0x20));
  Vector3<double>::Vector3((Vector3<double> *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
  OpenMD::operator*((double)in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
  OpenMD::operator*((double)in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
  OpenMD::operator+(in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
  Vector3<double>::Vector3((Vector3<double> *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
  OpenMD::operator*((double)in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
  OpenMD::operator*((double)in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
  OpenMD::operator+(in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
  Vector3<double>::Vector3((Vector3<double> *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
  OpenMD::operator*((double)in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
  OpenMD::operator*((double)in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
  OpenMD::operator+(in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
  Vector3<double>::Vector3((Vector3<double> *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
  OpenMD::operator*((double)in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
  OpenMD::operator*((double)in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
  OpenMD::operator+(in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
  Vector3<double>::Vector3((Vector3<double> *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
  OpenMD::operator*((double)in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
  Vector3<double>::Vector3((Vector3<double> *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
  OpenMD::operator*((double)in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
  Vector3<double>::Vector3((Vector3<double> *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
  local_2c8[0] = 0.0;
  Vector<double,_4U>::Vector(in_RDI,local_2c8);
  v2 = (Vector<double,_3U> *)(in_RSI + 0xe40);
  v1 = (Vector<double,_3U> *)dot<double,3u>(in_stack_fffffffffffffc90,v2);
  Vector<double,_3U>::length((Vector<double,_3U> *)0x16e721);
  Vector<double,_3U>::length((Vector<double,_3U> *)0x16e734);
  dVar4 = Polynomial<double>::evaluate(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
  pdVar2 = Vector<double,_4U>::operator[](in_RDI,0);
  *pdVar2 = dVar4;
  pdVar2 = (double *)(in_RSI + 0xe40);
  this_00 = (Polynomial<double> *)dot<double,3u>(v1,v2);
  Vector<double,_3U>::length((Vector<double,_3U> *)0x16e7c0);
  Vector<double,_3U>::length((Vector<double,_3U> *)0x16e7d3);
  dVar4 = Polynomial<double>::evaluate(this_00,pdVar2);
  pdVar3 = Vector<double,_4U>::operator[](in_RDI,1);
  *pdVar3 = dVar4;
  dot<double,3u>(v1,v2);
  Vector<double,_3U>::length((Vector<double,_3U> *)0x16e862);
  Vector<double,_3U>::length((Vector<double,_3U> *)0x16e875);
  dVar4 = Polynomial<double>::evaluate(this_00,pdVar2);
  pdVar3 = Vector<double,_4U>::operator[](in_RDI,2);
  *pdVar3 = dVar4;
  dot<double,3u>(v1,v2);
  Vector<double,_3U>::length((Vector<double,_3U> *)0x16e907);
  Vector<double,_3U>::length((Vector<double,_3U> *)0x16e91a);
  dVar4 = Polynomial<double>::evaluate(this_00,pdVar2);
  pdVar2 = Vector<double,_4U>::operator[](in_RDI,3);
  *pdVar2 = dVar4;
  return in_RDI;
}

Assistant:

Vector<RealType, 4> COHZ::calcCorrVal(int frame1, int frame2, int id1,
                                        int id2) {
    // Vectors v1x, v1y, and v1z are the body-fixed axes on the
    // molecule in frame 1 in the laboratory frame.

    // Vectors v2x, v2y, and v2z are the body-fixed axes on the
    // molecule in frame 2 in the laboratory frame.

    // Vectors u1 & u2 are the first OH bond vector in frames 1 & 2
    // respectively.  Here we assume SPC/E geometry.

    // Vectors w1 & w2 are the second OH bond vector in frames 1 & 2
    // respectively.  Here we assume SPC/E geometry.

    // Vectors h1 & h2 are the HH bond vectors in frames 1 & 2
    // respectively.  Here we assume SPC/E geometry again.

    // Vector3d v1x = sd1->getA(frame1).getRow(0);
    // Vector3d v2x = sd2->getA(frame2).getRow(0);

    Vector3d v1y = rotMats_[frame1][id1].getRow(yaxis_);
    Vector3d v1z = rotMats_[frame1][id1].getRow(axis_);

    Vector3d v2y = rotMats_[frame2][id2].getRow(yaxis_);
    Vector3d v2z = rotMats_[frame2][id2].getRow(axis_);

    Vector3d u1 = 0.81649 * v1y + 0.57736 * v1z;
    Vector3d u2 = 0.81649 * v2y + 0.57736 * v2z;

    Vector3d w1 = -0.81649 * v1y + 0.57736 * v1z;
    Vector3d w2 = -0.81649 * v2y + 0.57736 * v2z;

    Vector3d h1 = 1.63298 * v1y;
    Vector3d h2 = 1.63298 * v2y;

    // result is a Vector<RealType, 4> with Dipole, OH1, OH2, and HH:
    Vector<RealType, 4> r(0.0);
    r[0] = legendre_.evaluate(dot(v1z, v2z) / (v1z.length() * v2z.length()));
    r[1] = legendre_.evaluate(dot(u1, u2) / (u1.length() * u2.length()));
    r[2] = legendre_.evaluate(dot(w1, w2) / (w1.length() * w2.length()));
    r[3] = legendre_.evaluate(dot(h1, h2) / (h1.length() * h2.length()));
    return r;
  }